

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PSocket.cpp
# Opt level: O2

void __thiscall P2PSocket::P2PSocket(P2PSocket *this,int maxPeers,bool debug)

{
  _Rb_tree_header *p_Var1;
  undefined8 uVar2;
  long *plVar3;
  allocator<char> local_99;
  Peers local_98;
  
  this->m_debug = debug;
  SocketResource::SocketResource(&this->m_socket,-1);
  Peers::Peers(&this->m_peers);
  p_Var1 = &(this->m_events).super_EventRegister.m_events._M_t._M_impl.super__Rb_tree_header;
  (this->m_events).super_EventRegister.m_events._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->m_events).super_EventRegister.m_events._M_t._M_impl.super__Rb_tree_header.
           _M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->m_events).super_EventRegister.m_events._M_t._M_impl.super__Rb_tree_header.
           _M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->m_events).super_EventRegister.m_events._M_t._M_impl.super__Rb_tree_header.
           _M_header + 0x18) = p_Var1;
  (this->m_events).super_EventRegister.m_events._M_t._M_impl.super__Rb_tree_header._M_node_count = 0
  ;
  this->m_maxPeers = maxPeers;
  if (0xffffff00 < maxPeers - 0x100U) {
    Peers::Peers(&local_98,this);
    Peers::operator=(&this->m_peers,&local_98);
    Peers::~Peers(&local_98);
    return;
  }
  plVar3 = (long *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Max peers argument must be a valid single byte unsigned integer",
             &local_99);
  *plVar3 = (long)(plVar3 + 2);
  uVar2 = &local_98.m_peers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (local_98.m_peers._M_t._M_impl._0_8_ == uVar2) {
    *(uint *)(plVar3 + 2) =
         (uint)local_98.m_peers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    *(undefined4 *)((long)plVar3 + 0x14) =
         local_98.m_peers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_;
    *(undefined4 *)(plVar3 + 3) =
         local_98.m_peers._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_;
    *(undefined4 *)((long)plVar3 + 0x1c) =
         local_98.m_peers._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_;
  }
  else {
    *plVar3 = local_98.m_peers._M_t._M_impl._0_8_;
    plVar3[2] = CONCAT44(local_98.m_peers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent.
                         _4_4_,(uint)local_98.m_peers._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent);
  }
  plVar3[1] = local_98.m_peers._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  local_98.m_peers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98.m_peers._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_98.m_peers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ =
       (uint)local_98.m_peers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent & 0xffffff00;
  local_98.m_peers._M_t._M_impl._0_8_ = uVar2;
  __cxa_throw(plVar3,&P2PSocketException::typeinfo,P2PSocketException::~P2PSocketException);
}

Assistant:

P2PSocket::P2PSocket(int maxPeers, bool debug) : m_debug(debug), m_maxPeers(maxPeers)
{
    if (maxPeers < 0x01 || maxPeers > 0xFF) {
        throw P2PSocketException("Max peers argument must be a valid single byte unsigned integer");
    }

    m_peers = Peers(this);
}